

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::OnMemoryFill(SharedValidator *this,Location *loc)

{
  Result rhs;
  Var local_70;
  Enum local_24;
  Location *local_20;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_20 = loc;
  loc_local = (Location *)this;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = local_20;
  Var::Var(&local_70,0,local_20);
  local_24 = (Enum)CheckMemoryIndex(this,&local_70,(MemoryType *)0x0);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_24);
  Var::~Var(&local_70);
  rhs = TypeChecker::OnMemoryFill(&this->typechecker_);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnMemoryFill(const Location& loc) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc));
  result |= typechecker_.OnMemoryFill();
  return result;
}